

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::msgpack::
basic_msgpack_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::begin_object(basic_msgpack_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
               *this,item_event_visitor *visitor,uint8_t type,error_code *ec)

{
  int iVar1;
  size_t length;
  size_t local_30;
  parse_mode local_24;
  
  iVar1 = this->nesting_depth_;
  this->nesting_depth_ = iVar1 + 1;
  if (iVar1 < *(int *)((this->options_)._vptr_msgpack_decode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_msgpack_decode_options)) {
    local_30 = get_size(this,type,ec);
    if (this->more_ == true) {
      local_24 = map_key;
      std::vector<jsoncons::msgpack::parse_state,std::allocator<jsoncons::msgpack::parse_state>>::
      emplace_back<jsoncons::msgpack::parse_mode,unsigned_long&>
                ((vector<jsoncons::msgpack::parse_state,std::allocator<jsoncons::msgpack::parse_state>>
                  *)&this->state_stack_,&local_24,&local_30);
      (*visitor->_vptr_basic_item_event_visitor[4])(visitor,local_30,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
    }
  }
  else {
    std::error_code::operator=(ec,max_nesting_depth_exceeded);
    this->more_ = false;
  }
  return;
}

Assistant:

void begin_object(item_event_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = msgpack_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 
        std::size_t length = get_size(type, ec);
        if (!more_)
        {
            return;
        }
        state_stack_.emplace_back(parse_mode::map_key,length);
        visitor.begin_object(length, semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
    }